

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction_widgets.cpp
# Opt level: O2

void __thiscall QtWidgetsActionPrivate::setMenu(QtWidgetsActionPrivate *this,QObject *menu)

{
  QPointer<QMenu> *this_00;
  QAction *a;
  bool bVar1;
  QObject *ptr;
  
  a = *(QAction **)&this->field_0x8;
  ptr = (QObject *)QtPrivate::qobject_cast_helper<QMenu*,QObject>(menu);
  this_00 = &this->m_menu;
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar1) {
    QMenuPrivate::setOverrideMenuAction
              (*(QMenuPrivate **)((this->m_menu).wp.value + 8),(QAction *)0x0);
  }
  QWeakPointer<QObject>::assign<QObject>(&this_00->wp,ptr);
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar1) {
    QMenuPrivate::setOverrideMenuAction(*(QMenuPrivate **)((this->m_menu).wp.value + 8),a);
  }
  QActionPrivate::sendDataChanged();
  return;
}

Assistant:

void QtWidgetsActionPrivate::setMenu(QObject *menu)
{
    Q_Q(QAction);
    QMenu *theMenu = qobject_cast<QMenu*>(menu);
    Q_ASSERT_X(!menu || theMenu, "QAction::setMenu",
               "QAction::setMenu expects a QMenu* in widget applications");
    if (m_menu)
        m_menu->d_func()->setOverrideMenuAction(nullptr); //we reset the default action of any previous menu
    m_menu = theMenu;
    if (m_menu)
        m_menu->d_func()->setOverrideMenuAction(q);
    sendDataChanged();
}